

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(const_iterator *a,const_iterator *b)

{
  const_iterator *pcVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  void *p;
  const_iterator *in_RCX;
  const_iterator *pcVar2;
  const_iterator *in_RDX;
  RawHashSetLayout RStack_40;
  
  if ((a == (const_iterator *)
            absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       a == (const_iterator *)0x0) || (-1 < *(char *)&(a->inner_).ctrl_)) {
    if ((in_RDX != (const_iterator *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         in_RDX != (const_iterator *)0x0) && ((char)*(code *)&(in_RDX->inner_).ctrl_ < '\0'))
    goto LAB_0025f2f0;
    if (a == (const_iterator *)
             absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        in_RDX == (const_iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_0025f2d9:
      return a == in_RDX;
    }
    if ((a == (const_iterator *)
              absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (in_RDX ==
        (const_iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
    {
      if (a == (const_iterator *)0x0 || in_RDX == (const_iterator *)0x0) goto LAB_0025f2d9;
      if ((in_RDX == (const_iterator *)&kSooControl) == (a == (const_iterator *)&kSooControl)) {
        if (a == (const_iterator *)&kSooControl) {
          if (b == in_RCX) goto LAB_0025f2d9;
        }
        else {
          pcVar2 = in_RCX;
          pcVar1 = in_RDX;
          if (in_RDX < a) {
            pcVar2 = b;
            pcVar1 = a;
            b = in_RCX;
          }
          if ((pcVar1 < b) && (b <= pcVar2)) goto LAB_0025f2d9;
        }
      }
      operator==();
      goto LAB_0025f2eb;
    }
  }
  else {
LAB_0025f2eb:
    operator==();
LAB_0025f2f0:
    operator==();
  }
  operator==();
  if ((CommonFields *)a == (CommonFields *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
    ::iterator::operator*((iterator *)0x0);
  }
  else if (a != (const_iterator *)
                absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
    if (-1 < (char)*(code *)&((iterator *)&((CommonFields *)a)->capacity_)->ctrl_) {
      return (bool)extraout_AL;
    }
    goto LAB_0025f321;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
  ::iterator::operator*((iterator *)a);
LAB_0025f321:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
  ::iterator::operator*((iterator *)a);
  if (((CommonFields *)a != (CommonFields *)0x0) && (((CommonFields *)a)->capacity_ != 0)) {
    if ((((CommonFields *)a)->size_ & 1) != 0) {
      CommonFields::backing_array_start((CommonFields *)a);
    }
    p = CommonFields::backing_array_start((CommonFields *)a);
    RawHashSetLayout::RawHashSetLayout
              (&RStack_40,((CommonFields *)a)->capacity_,8,
               (bool)((byte)(int)((CommonFields *)a)->size_ & 1));
    Deallocate<8ul,std::allocator<google::protobuf::internal::ExtensionInfo>>
              ((allocator<google::protobuf::internal::ExtensionInfo> *)a,p,
               RStack_40.capacity_ * 0x30 + RStack_40.slot_offset_);
  }
  operator_delete(a,0x20);
  return (bool)extraout_AL_00;
}

Assistant:

bool operator==(const const_iterator& a, const const_iterator& b) {
      return a.inner_ == b.inner_;
    }